

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

BOOL __thiscall
Memory::HeapPageAllocator<Memory::PreReservedVirtualAllocWrapper>::ProtectPages
          (HeapPageAllocator<Memory::PreReservedVirtualAllocWrapper> *this,char *address,
          size_t pageCount,void *segmentParam,DWORD dwVirtualProtectFlags,
          DWORD desiredOldProtectFlag)

{
  HANDLE pVVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  char *pcVar5;
  size_t sVar6;
  HANDLE pVVar7;
  undefined8 *in_FS_OFFSET;
  DWORD local_84;
  BOOL retVal;
  DWORD oldProtect;
  size_t bytes;
  MEMORY_BASIC_INFORMATION memBasicInfo;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *pageSegment;
  SegmentBase<Memory::PreReservedVirtualAllocWrapper> *segment;
  DWORD desiredOldProtectFlag_local;
  DWORD dwVirtualProtectFlags_local;
  void *segmentParam_local;
  size_t pageCount_local;
  char *address_local;
  HeapPageAllocator<Memory::PreReservedVirtualAllocWrapper> *this_local;
  
  pcVar5 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetAddress
                     ((SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentParam);
  if (address < pcVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0xa3f,"(address >= segment->GetAddress())",
                       "address >= segment->GetAddress()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  pcVar5 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetAddress
                     ((SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentParam);
  sVar6 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetPageCount
                    ((SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentParam);
  if ((sVar6 - pageCount) * 0x1000 < (ulong)(uint)((int)address - (int)pcVar5)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0xa40,
                       "(((uint)(((char *)address) - segment->GetAddress()) <= (segment->GetPageCount() - pageCount) * AutoSystemInfo::PageSize))"
                       ,
                       "((uint)(((char *)address) - segment->GetAddress()) <= (segment->GetPageCount() - pageCount) * AutoSystemInfo::PageSize)"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  bVar3 = PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
          ::IsPageSegment(&this->
                           super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                          ,(SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentParam);
  if (bVar3) {
    memBasicInfo._40_8_ = segmentParam;
    if (0xffffffff < pageCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0xa45,"(pageCount <= ((uint32_t)~((uint32_t)0)))",
                         "PageSegment should always be smaller than 4G pages");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    bVar3 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::IsFreeOrDecommitted
                      ((PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)
                       memBasicInfo._40_8_,address,(uint)pageCount);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0xa46,
                         "(!pageSegment->IsFreeOrDecommitted(address, static_cast<uint>(pageCount)))"
                         ,"!pageSegment->IsFreeOrDecommitted(address, static_cast<uint>(pageCount))"
                        );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
  }
  if ((((ulong)address & 0xfff) == 0) &&
     (pcVar5 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetAddress
                         ((SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentParam),
     pcVar5 <= address)) {
    pcVar5 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetAddress
                       ((SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentParam);
    sVar6 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetPageCount
                      ((SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentParam);
    if ((ulong)(uint)((int)address - (int)pcVar5) <= (sVar6 - pageCount) * 0x1000) {
      pVVar1 = (this->
               super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
               ).processHandle;
      pVVar7 = GetCurrentProcess();
      if (pVVar1 != pVVar7) {
        return 1;
      }
      _retVal = VirtualQuery(address,(PMEMORY_BASIC_INFORMATION)&bytes,0x30);
      if (_retVal == 0) {
        MemoryOperationLastError::RecordLastError();
      }
      if (((_retVal == 0) || ((ulong)memBasicInfo._16_8_ < pageCount << 0xc)) ||
         (desiredOldProtectFlag != memBasicInfo.RegionSize._4_4_)) {
        CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
        return 0;
      }
      bVar3 = Js::ConfigFlagsTable::IsEnabled
                        ((this->
                         super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                         ).pageAllocatorFlagTable,TraceProtectPagesFlag);
      if (bVar3) {
        Output::Print(L"VirtualProtect(0x%p, %d, %d, %d)\n",address,pageCount,pageCount << 0xc,
                      (ulong)dwVirtualProtectFlags);
      }
      BVar4 = VirtualProtect(address,pageCount << 0xc,dwVirtualProtectFlags,&local_84);
      if (BVar4 == 0) {
        CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
        return 0;
      }
      if (local_84 == desiredOldProtectFlag) {
        return BVar4;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0xa8a,"(oldProtect == desiredOldProtectFlag)",
                         "oldProtect == desiredOldProtectFlag");
      if (bVar3) {
        *(undefined4 *)*in_FS_OFFSET = 0;
        return BVar4;
      }
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
  }
  CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
  return 0;
}

Assistant:

BOOL
HeapPageAllocator<T>::ProtectPages(__in char* address, size_t pageCount, __in void* segmentParam, DWORD dwVirtualProtectFlags, DWORD desiredOldProtectFlag)
{
    SegmentBase<T> * segment = (SegmentBase<T>*)segmentParam;
#if DBG
    Assert(address >= segment->GetAddress());
    Assert(((uint)(((char *)address) - segment->GetAddress()) <= (segment->GetPageCount() - pageCount) * AutoSystemInfo::PageSize));

    if (this->IsPageSegment(segment))
    {
        PageSegmentBase<T> * pageSegment = static_cast<PageSegmentBase<T>*>(segment);
        AssertMsg(pageCount <= MAXUINT32, "PageSegment should always be smaller than 4G pages");
        Assert(!pageSegment->IsFreeOrDecommitted(address, static_cast<uint>(pageCount)));
    }
#endif

    // check address alignment, and that the address is in correct range
    if (((uintptr_t)address & (AutoSystemInfo::PageSize - 1)) != 0
        || address < segment->GetAddress()
        || ((uint)(((char *)address) - segment->GetAddress()) > (segment->GetPageCount() - pageCount) * AutoSystemInfo::PageSize))
    {
        // OOPJIT TODO: don't bring down the whole JIT process
        CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
        return FALSE;
    }


    // OOP JIT page protection is immutable
    if (this->processHandle != GetCurrentProcess())
    {
        return TRUE;
    }
    MEMORY_BASIC_INFORMATION memBasicInfo;

    // check old protection on all pages about to change, ensure the fidelity
    size_t bytes = VirtualQuery(address, &memBasicInfo, sizeof(memBasicInfo));
    if (bytes == 0)
    {
        MemoryOperationLastError::RecordLastError();
    }
    if (bytes == 0
        || memBasicInfo.RegionSize < pageCount * AutoSystemInfo::PageSize
        || desiredOldProtectFlag != memBasicInfo.Protect)
    {
        CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
        return FALSE;
    }

    /*Verify if we always pass the PAGE_TARGETS_NO_UPDATE flag, if the protect flag is EXECUTE*/
#if defined(_CONTROL_FLOW_GUARD)
    if (GlobalSecurityPolicy::IsCFGEnabled() &&
        (dwVirtualProtectFlags & (PAGE_EXECUTE | PAGE_EXECUTE_READ | PAGE_EXECUTE_READWRITE)) &&
        ((dwVirtualProtectFlags & PAGE_TARGETS_NO_UPDATE) == 0))
    {
        CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
        return FALSE;
    }
#endif

#if defined(ENABLE_JIT_CLAMP)
    bool makeExecutable = (dwVirtualProtectFlags & (PAGE_EXECUTE | PAGE_EXECUTE_READ | PAGE_EXECUTE_READWRITE)) ? true : false;

    AutoEnableDynamicCodeGen enableCodeGen(makeExecutable);
#endif

#if DBG_DUMP || defined(RECYCLER_TRACE)
    if (this->pageAllocatorFlagTable.IsEnabled(Js::TraceProtectPagesFlag))
    {
        Output::Print(_u("VirtualProtect(0x%p, %d, %d, %d)\n"), address, pageCount, pageCount * AutoSystemInfo::PageSize, dwVirtualProtectFlags);
    }
#endif

    DWORD oldProtect; // this is only for first page
    BOOL retVal = VirtualProtect(address, pageCount * AutoSystemInfo::PageSize, dwVirtualProtectFlags, &oldProtect);
    if (retVal == FALSE)
    {
        CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
    }
    else
    {
        Assert(oldProtect == desiredOldProtectFlag);
    }

    return retVal;
}